

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * __thiscall pugi::xml_node::child_value(xml_node *this,char_t *name_)

{
  char_t *pcVar1;
  xml_node local_20;
  char_t *local_18;
  char_t *name__local;
  xml_node *this_local;
  
  local_18 = name_;
  name__local = (char_t *)this;
  local_20 = child(this,name_);
  pcVar1 = child_value(&local_20);
  return pcVar1;
}

Assistant:

PUGI__FN const char_t* xml_node::child_value(const char_t* name_) const
	{
		return child(name_).child_value();
	}